

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O2

string * __thiscall
helics::apps::zmqBrokerServer::generateResponseToMessage_abi_cxx11_
          (string *__return_storage_ptr__,zmqBrokerServer *this,message_t *msg,portData *pdata,
          CoreType ctype)

{
  __type _Var1;
  size_t sVar2;
  void *pvVar3;
  ActionMessage rxcmd;
  ActionMessage rep;
  string_view in_stack_fffffffffffffe38;
  GlobalFederateId *local_1a0 [2];
  GlobalFederateId local_190 [42];
  ActionMessage local_e8;
  
  sVar2 = zmq::message_t::size(msg);
  if (sVar2 < 0x19) {
    pvVar3 = zmq::message_t::data(msg);
    sVar2 = zmq::message_t::size(msg);
    local_1a0[0] = &((ActionMessage *)local_1a0)->dest_id;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,pvVar3,sVar2 + (long)pvVar3)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe40,"close_server:",
               (allocator<char> *)&stack0xfffffffffffffe3f);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe40,&this->name_);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
    std::__cxx11::string::~string((string *)local_1a0);
    if (_Var1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a0,"close_server:",(allocator<char> *)&local_e8);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     &this->name_);
      std::__cxx11::string::~string((string *)local_1a0);
      return __return_storage_ptr__;
    }
  }
  else {
    pvVar3 = zmq::message_t::data(msg);
    sVar2 = zmq::message_t::size(msg);
    ActionMessage::ActionMessage((ActionMessage *)local_1a0,pvVar3,sVar2);
    TypedBrokerServer::generateMessageResponse(&local_e8,(ActionMessage *)local_1a0,pdata,ctype);
    if (local_e8.messageAction != cmd_ignore) {
      ActionMessage::to_string_abi_cxx11_((string *)__return_storage_ptr__,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
      ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
      return __return_storage_ptr__;
    }
    ActionMessage::~ActionMessage(&local_e8);
    ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
  }
  sVar2 = zmq::message_t::size(msg);
  CLI::std::__cxx11::to_string((string *)&local_e8,sVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 "received unknown message of length ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8);
  TypedBrokerServer::logMessage(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"ignored",(allocator<char> *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string
    zmqBrokerServer::generateResponseToMessage(zmq::message_t& msg, portData& pdata, CoreType ctype)
{
    auto sz = msg.size();
    if (sz < 25) {
        if (std::string(static_cast<char*>(msg.data()), msg.size()) ==
            std::string("close_server:") + name_) {
            //      std::cerr << "received close server message" << std::endl;
            return std::string("close_server:") + name_;
        }
    } else {
        ActionMessage rxcmd(static_cast<char*>(msg.data()), msg.size());
        auto rep = generateMessageResponse(rxcmd, pdata, ctype);
        if (rep.action() != CMD_IGNORE) {
            return rep.to_string();
        }
    }
    logMessage("received unknown message of length " + std::to_string(msg.size()));
    return "ignored";
}